

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O0

bool __thiscall ON_Matrix::Scale(ON_Matrix *this,double s)

{
  double *local_38;
  double *p;
  int *piStack_28;
  int i;
  DBLBLK *cmem;
  bool rc;
  double s_local;
  ON_Matrix *this_local;
  
  cmem._7_1_ = false;
  if ((0 < this->m_row_count) && (0 < this->m_col_count)) {
    for (piStack_28 = (int *)this->m_cmem; piStack_28 != (int *)0x0;
        piStack_28 = *(int **)(piStack_28 + 4)) {
      if ((*(long *)(piStack_28 + 2) != 0) && (0 < *piStack_28)) {
        local_38 = *(double **)(piStack_28 + 2);
        p._4_4_ = *piStack_28;
        while (p._4_4_ != 0) {
          *local_38 = s * *local_38;
          local_38 = local_38 + 1;
          p._4_4_ = p._4_4_ + -1;
        }
      }
    }
    cmem._7_1_ = true;
  }
  return cmem._7_1_;
}

Assistant:

bool ON_Matrix::Scale( double s )
{
  bool rc = false;
  if ( m_row_count > 0 && m_col_count > 0 ) 
  {
    struct DBLBLK* cmem = (struct DBLBLK*)m_cmem;
    int i;
    double* p;
    while ( 0 != cmem )
    {
      if ( 0 != cmem->a && cmem->count > 0 )
      {
        p = cmem->a;
        i = cmem->count;
        while(i--)
          *p++ *= s;
      }
      cmem = cmem->next;
    }
    rc = true;
  }
  /*
  int i = m_a.Capacity();
  if ( m_row_count > 0 && m_col_count > 0 && m_row_count*m_col_count <= i ) {
    double* p = m_a.Array();
    while ( i-- )
      *p++ *= s;
    rc = true;
  }
  */
  return rc;
}